

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

Vec_Ptr_t * Saig_ManBmcTerSimPo(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  uint local_24;
  int nPoBin;
  int i;
  uint *pInfo;
  Vec_Ptr_t *vInfos;
  Aig_Man_t *p_local;
  
  _nPoBin = (uint *)0x0;
  p_00 = Vec_PtrAlloc(100);
  local_24 = 0;
  while( true ) {
    if ((int)local_24 % 100 == 0) {
      Abc_Print(1,"Frame %5d\n",(ulong)local_24);
    }
    _nPoBin = Saig_ManBmcTerSimOne(p,_nPoBin);
    Vec_PtrPush(p_00,_nPoBin);
    iVar1 = Saig_ManBmcTerSimCount01Po(p,_nPoBin);
    iVar2 = Saig_ManPoNum(p);
    if (iVar1 < iVar2) break;
    local_24 = local_24 + 1;
  }
  Abc_Print(1,"Detected terminary PO in frame %d.\n",(ulong)local_24);
  Saig_ManBmcCountNonternary(p,p_00,local_24);
  return p_00;
}

Assistant:

Vec_Ptr_t * Saig_ManBmcTerSimPo( Aig_Man_t * p )
{
    Vec_Ptr_t * vInfos;
    unsigned * pInfo = NULL;
    int i, nPoBin;
    vInfos = Vec_PtrAlloc( 100 );
    for ( i = 0; ; i++ )
    {
        if ( i % 100 == 0 )
            Abc_Print( 1, "Frame %5d\n", i );
        pInfo = Saig_ManBmcTerSimOne( p, pInfo );
        Vec_PtrPush( vInfos, pInfo );
        nPoBin = Saig_ManBmcTerSimCount01Po( p, pInfo );
        if ( nPoBin < Saig_ManPoNum(p) )
            break;
    }
    Abc_Print( 1, "Detected terminary PO in frame %d.\n", i );
    Saig_ManBmcCountNonternary( p, vInfos, i );
    return vInfos;
}